

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http-test.c++
# Opt level: O2

Promise<void> __thiscall
kj::(anonymous_namespace)::TestCase4992::run()::$_0::operator()(kj::HttpServer::SuspendableRequest&)
::Response__(void *this,HttpMethod method,StringPtr url,HttpHeaders *headers,
            AsyncInputStream *requestBody,Response *response)

{
  PromiseArena *pPVar1;
  SourceLocation location;
  OwnPromiseNode OVar2;
  void *pvVar3;
  undefined4 in_register_00000034;
  SimpleTransformPromiseNode<void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_compat_http_test_c__:5018:26)>
  *location_00;
  OwnPromiseNode intermediate;
  void *continuationTracePtr;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> local_80;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> local_78;
  code *local_70;
  OwnPromiseNode local_68;
  undefined *local_60;
  undefined *puStack_58;
  undefined8 local_50;
  anon_class_32_4_7c174187_for_func local_48;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> local_28;
  
  local_48.serviceCount = *(uint **)(CONCAT44(in_register_00000034,method) + 0x40);
  local_48.table = (HttpHeaderTable *)(CONCAT44(in_register_00000034,method) + 8);
  local_48.requestBody = (AsyncInputStream *)response;
  yield();
  local_70 = kj::_::
             SimpleTransformPromiseNode<void,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http-test.c++:5018:26)>
             ::anon_class_32_4_7c174187_for_func::operator();
  pPVar1 = ((local_80.ptr)->super_PromiseArenaMember).arena;
  if (pPVar1 == (PromiseArena *)0x0 || (ulong)((long)local_80.ptr - (long)pPVar1) < 0x40) {
    pvVar3 = operator_new(0x400);
    location_00 = (SimpleTransformPromiseNode<void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_compat_http_test_c__:5018:26)>
                   *)((long)pvVar3 + 0x3c0);
    kj::operator()(location_00,&local_80,&local_48,&local_70);
    *(void **)((long)pvVar3 + 0x3c8) = pvVar3;
  }
  else {
    ((local_80.ptr)->super_PromiseArenaMember).arena = (PromiseArena *)0x0;
    location_00 = (SimpleTransformPromiseNode<void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_compat_http_test_c__:5018:26)>
                   *)(local_80.ptr + -4);
    kj::operator()(location_00,&local_80,&local_48,&local_70);
    local_80.ptr[-4].super_PromiseArenaMember.arena = pPVar1;
  }
  local_60 = &DAT_003d3151;
  puStack_58 = &DAT_003d31b0;
  local_50 = 0x4c0000058b;
  location.function = &DAT_003d31b0;
  location.fileName = &DAT_003d3151;
  location.lineNumber = 0x58b;
  location.columnNumber = 0x4c;
  local_78.ptr = (PromiseNode *)location_00;
  kj::_::maybeChain<void>(&local_68,(Promise<void> *)&local_78,location);
  OVar2.ptr = local_68.ptr;
  local_68.ptr = (PromiseNode *)0x0;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(&local_68);
  *(PromiseNode **)this = OVar2.ptr;
  local_28.ptr = (PromiseNode *)0x0;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(&local_28);
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(&local_78);
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(&local_80);
  return (PromiseBase)(PromiseBase)this;
}

Assistant:

kj::Promise<void> request(
          HttpMethod method, kj::StringPtr url, const HttpHeaders& headers,
          kj::AsyncInputStream& requestBody, Response& response) override {
        return evalLater([&serviceCount = serviceCount, &table = table, &requestBody, &response]() {
          // This KJ_EXPECT here is the entire point of this test.
          KJ_EXPECT(serviceCount == 1)
          HttpHeaders responseHeaders(table);
          response.send(200, "OK", responseHeaders);
          return requestBody.readAllBytes().ignoreResult();
        });
      }